

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedShaderImpl.cpp
# Opt level: O0

vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
* __thiscall
Diligent::SerializedShaderImpl::GetCompileTasks
          (vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
           *__return_storage_ptr__,SerializedShaderImpl *this)

{
  bool bVar1;
  const_iterator pvVar2;
  pointer pCVar3;
  RefCntAutoPtr<Diligent::IAsyncTask> local_48;
  RefCntAutoPtr<Diligent::IAsyncTask> pTask;
  value_type *pCompiledShader;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::unique_ptr<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>,_7UL>
  *__range1;
  SerializedShaderImpl *this_local;
  vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
  *Tasks;
  
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
  ::vector(__return_storage_ptr__);
  __end1 = std::
           array<std::unique_ptr<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>,_7UL>
           ::begin(&this->m_Shaders);
  pvVar2 = std::
           array<std::unique_ptr<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>,_7UL>
           ::end(&this->m_Shaders);
  for (; __end1 != pvVar2; __end1 = __end1 + 1) {
    pTask.m_pObject = (IAsyncTask *)__end1;
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)__end1);
    if (bVar1) {
      pCVar3 = std::
               unique_ptr<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
               ::operator->((unique_ptr<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
                             *)pTask.m_pObject);
      (*pCVar3->_vptr_CompiledShader[6])(&local_48);
    }
    else {
      RefCntAutoPtr<Diligent::IAsyncTask>::RefCntAutoPtr(&local_48);
    }
    bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&local_48);
    if (bVar1) {
      std::
      vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>>
      ::emplace_back<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>
                ((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>>
                  *)__return_storage_ptr__,&local_48);
    }
    RefCntAutoPtr<Diligent::IAsyncTask>::~RefCntAutoPtr(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RefCntAutoPtr<IAsyncTask>> SerializedShaderImpl::GetCompileTasks() const
{
    std::vector<RefCntAutoPtr<IAsyncTask>> Tasks;
    for (const auto& pCompiledShader : m_Shaders)
    {
        if (RefCntAutoPtr<IAsyncTask> pTask{pCompiledShader ? pCompiledShader->GetCompileTask() : RefCntAutoPtr<IAsyncTask>{}})
        {
            Tasks.emplace_back(std::move(pTask));
        }
    }
    return Tasks;
}